

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O3

void __thiscall
LinearScan::ProcessSecondChanceBoundaryHelper
          (LinearScan *this,BranchInstr *branchInstr,LabelInstr *branchLabel)

{
  RealCount *pRVar1;
  OpCode OVar2;
  SList<Lifetime_**,_Memory::ArenaAllocator,_RealCount> *pSVar3;
  code *pcVar4;
  bool bVar5;
  uint32 uVar6;
  uint32 uVar7;
  undefined4 *puVar8;
  Type pSVar9;
  Instr *pIVar10;
  LoweredBasicBlock *pLVar11;
  
  uVar6 = IR::Instr::GetNumber(&branchInstr->super_Instr);
  uVar7 = IR::Instr::GetNumber(&branchLabel->super_Instr);
  if (uVar7 < uVar6) {
    if ((branchLabel->field_0x78 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0xebe,"(branchLabel->m_isLoopTop)","branchLabel->m_isLoopTop");
      if (!bVar5) goto LAB_00587db5;
      *puVar8 = 0;
    }
    branchInstr->m_regContent = (Lifetime **)0x0;
    InsertSecondChanceCompensation
              (this,this->regContent,branchLabel->m_regContent,branchInstr,branchLabel);
    return;
  }
  SaveRegContent(this,&branchInstr->super_Instr);
  if (this->curLoop != (Loop *)0x0) {
    pSVar3 = (this->curLoop->regAlloc).exitRegContentList;
    pSVar9 = (Type)new<Memory::ArenaAllocator>(0x10,pSVar3->allocator,0x364470);
    pSVar9[1].next = (Type)branchInstr->m_regContent;
    pSVar9->next = (pSVar3->super_SListBase<Lifetime_**,_Memory::ArenaAllocator,_RealCount>).
                   super_SListNodeBase<Memory::ArenaAllocator>.next;
    (pSVar3->super_SListBase<Lifetime_**,_Memory::ArenaAllocator,_RealCount>).
    super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar9;
    pRVar1 = &(pSVar3->super_SListBase<Lifetime_**,_Memory::ArenaAllocator,_RealCount>).
              super_RealCount;
    pRVar1->count = pRVar1->count + 1;
  }
  if (branchLabel->m_loweredBasicBlock != (LoweredBasicBlock *)0x0) {
    pLVar11 = this->currentBlock;
    if (((pLVar11->inlineeFrameLifetimes).
         super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>.count < 1) &&
       ((pLVar11->inlineeStack).
        super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>.count < 1)) {
      return;
    }
    bVar5 = LoweredBasicBlock::Equals(branchLabel->m_loweredBasicBlock,pLVar11);
    if (bVar5) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xeec,
                       "(!currentBlock->HasData() || branchLabel->m_loweredBasicBlock->Equals(this->currentBlock))"
                       ,
                       "!currentBlock->HasData() || branchLabel->m_loweredBasicBlock->Equals(this->currentBlock)"
                      );
    if (bVar5) {
      *puVar8 = 0;
      return;
    }
    goto LAB_00587db5;
  }
  OVar2 = (branchInstr->super_Instr).m_opcode;
  if (OVar2 < ADD) {
    if ((OVar2 == MultiBr) || (OVar2 == Br)) goto LAB_00587c7f;
  }
  else {
    bVar5 = LowererMD::IsUnconditionalBranch(&branchInstr->super_Instr);
    if (bVar5) {
LAB_00587c7f:
      if (branchInstr->m_branchTarget == (LabelInstr *)0x0) {
        if (branchInstr->m_isMultiBranch == false) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x20e,"(m_isMultiBranch)","m_isMultiBranch");
          if (!bVar5) goto LAB_00587db5;
          *puVar8 = 0;
        }
      }
      else {
        if (branchInstr->m_isMultiBranch != false) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x209,"(!m_isMultiBranch)","!m_isMultiBranch");
          if (!bVar5) {
LAB_00587db5:
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          *puVar8 = 0;
        }
        pIVar10 = IR::Instr::GetNextRealInstr(&branchLabel->super_Instr);
        if (pIVar10->m_opcode == FunctionExit) {
          return;
        }
        if (pIVar10->m_opcode == BailOutStackRestore) {
          return;
        }
        if (((this->currentBlock->inlineeFrameLifetimes).
             super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>.count < 1)
           && ((this->currentBlock->inlineeStack).
               super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>.count < 1)) {
          return;
        }
        pIVar10 = IR::Instr::GetNextRealInstrOrLabel(&branchInstr->super_Instr);
        if ((pIVar10->m_kind == InstrKindProfiledLabel) || (pIVar10->m_kind == InstrKindLabel)) {
          pLVar11 = this->currentBlock;
          goto LAB_00587da5;
        }
      }
    }
  }
  pLVar11 = LoweredBasicBlock::Clone(this->currentBlock,this->tempAlloc);
LAB_00587da5:
  branchLabel->m_loweredBasicBlock = pLVar11;
  return;
}

Assistant:

void
LinearScan::ProcessSecondChanceBoundaryHelper(IR::BranchInstr *branchInstr, IR::LabelInstr *branchLabel)
{
    if (branchInstr->GetNumber() > branchLabel->GetNumber())
    {
        // Loop back-edge
        Assert(branchLabel->m_isLoopTop);
        branchInstr->m_regContent = nullptr;
        this->InsertSecondChanceCompensation(this->regContent, branchLabel->m_regContent, branchInstr, branchLabel);
    }
    else
    {
        // Forward branch
        this->SaveRegContent(branchInstr);
        if (this->curLoop)
        {
            this->curLoop->regAlloc.exitRegContentList->Prepend(branchInstr->m_regContent);
        }
        if (!branchLabel->m_loweredBasicBlock)
        {
            if (branchInstr->IsConditional() || branchInstr->IsMultiBranch())
            {
                // Clone with deep copy
                branchLabel->m_loweredBasicBlock = this->currentBlock->Clone(this->tempAlloc);
            }
            else
            {
                // If the unconditional branch leads to the end of the function for the scenario of a bailout - we do not want to
                // copy the lowered inlinee info.
                IR::Instr* nextInstr = branchLabel->GetNextRealInstr();
                if (nextInstr->m_opcode != Js::OpCode::FunctionExit &&
                    nextInstr->m_opcode != Js::OpCode::BailOutStackRestore &&
                    this->currentBlock->HasData())
                {
                    IR::Instr* branchNextInstr = branchInstr->GetNextRealInstrOrLabel();
                    if (branchNextInstr->IsLabelInstr())
                    {
                        // Clone with shallow copy
                        branchLabel->m_loweredBasicBlock = this->currentBlock;
                    }
                    else
                    {
                        // Dead code after the unconditional branch causes the currentBlock data to be freed later on...
                        // Deep copy in this case.
                        branchLabel->m_loweredBasicBlock = this->currentBlock->Clone(this->tempAlloc);
                    }
                }
            }
        }
        else
        {
            // The lowerer sometimes generates unreachable blocks that would have empty data.
            Assert(!currentBlock->HasData() || branchLabel->m_loweredBasicBlock->Equals(this->currentBlock));
        }
    }
}